

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_client_transporter.cpp
# Opt level: O0

void __thiscall
SocketClientTransporter::OnConnection(SocketClientTransporter *this,uv_connect_t *req,int status)

{
  int status_local;
  uv_connect_t *req_local;
  SocketClientTransporter *this_local;
  
  this->connectionStatus = status;
  if (status < 0) {
    (*(this->super_Transporter)._vptr_Transporter[2])();
    (*(this->super_Transporter)._vptr_Transporter[5])(this,0);
  }
  else {
    (*(this->super_Transporter)._vptr_Transporter[5])(this,1);
    uv_read_start((uv_stream_t *)&this->uvClient,echo_alloc,after_read);
  }
  std::condition_variable::notify_all();
  return;
}

Assistant:

void SocketClientTransporter::OnConnection(uv_connect_t* req, int status) {
	this->connectionStatus = status;
	if (status >= 0) {
		OnConnect(true);
		uv_read_start((uv_stream_t*)&uvClient, echo_alloc, after_read);
	}
	else {
		Stop();
		OnConnect(false);
	}
	cv.notify_all();
}